

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

bool __thiscall adios2::core::IO::RemoveAttribute(IO *this,string *name)

{
  int iVar1;
  iterator __it;
  bool bVar2;
  ScopedTimer __var2385;
  ScopedTimer local_20;
  
  if (RemoveAttribute(std::__cxx11::string_const&)::__var385 == '\0') {
    iVar1 = __cxa_guard_acquire(&RemoveAttribute(std::__cxx11::string_const&)::__var385);
    if (iVar1 != 0) {
      RemoveAttribute::__var385 = (void *)ps_timer_create_("IO::RemoveAttribute");
      __cxa_guard_release(&RemoveAttribute(std::__cxx11::string_const&)::__var385);
    }
  }
  local_20.m_timer = RemoveAttribute::__var385;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  __it = std::
         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         ::find(&(this->m_Attributes)._M_h,name);
  if (__it.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = *(int *)(*(long *)((long)__it.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                     ._M_cur + 0x28) + 0x28) != 0;
    if (bVar2) {
      bVar2 = true;
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(&(this->m_Attributes)._M_h,
              (const_iterator)
              __it.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
              ._M_cur);
    }
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_20);
  return bVar2;
}

Assistant:

bool IO::RemoveAttribute(const std::string &name) noexcept
{
    PERFSTUBS_SCOPED_TIMER("IO::RemoveAttribute");
    bool isRemoved = false;
    auto itAttribute = m_Attributes.find(name);
    // attribute exists
    if (itAttribute != m_Attributes.end())
    {
        // first remove the Attribute object
        const DataType type(itAttribute->second->m_Type);

        if (type == DataType::None)
        {
            // nothing to do
        }
        else
        {
            m_Attributes.erase(itAttribute);
            isRemoved = true;
        }
    }

    return isRemoved;
}